

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::XdlEncoder(XdlEncoder *this)

{
  XdlSinkString *this_00;
  char local_1e [14];
  XdlEncoder *local_10;
  XdlEncoder *this_local;
  
  local_10 = this;
  asl::String::String(&this->_out);
  asl::String::String(&this->_indent);
  asl::String::String(&this->_sep1);
  asl::String::String(&this->_sep2);
  this->_level = 0;
  this->_pretty = false;
  this->_json = false;
  asl::String::resize(&this->_out,0x200,true,true);
  local_1e[1] = 0x2c;
  asl::String::operator=(&this->_sep1,local_1e + 1);
  local_1e[0] = ',';
  asl::String::operator=(&this->_sep2,local_1e);
  this->_simple = false;
  this->_fmtF = "%.9g";
  this->_fmtD = "%.17g";
  this_00 = (XdlSinkString *)operator_new(0x10);
  XdlSinkString::XdlSinkString(this_00,&this->_out);
  this->_sink = (XdlSink *)this_00;
  return;
}

Assistant:

XdlEncoder::XdlEncoder()
{
	_level = 0;
	_pretty = false;
	_json = false;
	_out.resize(512);
	_sep1 = ',';
	_sep2 = ',';
	_simple = false;
	_fmtF = "%.9g";
	_fmtD = "%.17g";
	_sink = new XdlSinkString(_out);
}